

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.cc
# Opt level: O0

Token * __thiscall
qpdf::Tokenizer::readToken
          (Token *__return_storage_ptr__,Tokenizer *this,InputSource *input,string *context,
          bool allow_bad,size_t max_len)

{
  token_type_e tVar1;
  QPDFExc *this_00;
  string *filename;
  ulong uVar2;
  qpdf_offset_t qVar3;
  string *message;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  char local_3b;
  bool local_3a [2];
  char char_to_unread;
  bool unread_char;
  size_t sStack_38;
  size_t max_len_local;
  string *psStack_28;
  bool allow_bad_local;
  string *context_local;
  InputSource *input_local;
  Tokenizer *this_local;
  Token *token;
  
  sStack_38 = max_len;
  max_len_local._7_1_ = allow_bad;
  psStack_28 = context;
  context_local = (string *)input;
  input_local = (InputSource *)this;
  this_local = (Tokenizer *)__return_storage_ptr__;
  nextToken(this,input,context,max_len);
  local_3a[1] = false;
  QPDFTokenizer::Token::Token(__return_storage_ptr__);
  getToken(this,__return_storage_ptr__,local_3a,&local_3b);
  tVar1 = QPDFTokenizer::Token::getType(__return_storage_ptr__);
  if (tVar1 == tt_bad) {
    if ((max_len_local._7_1_ & 1) == 0) {
      this_00 = (QPDFExc *)__cxa_allocate_exception(0x80);
      filename = (string *)(**(code **)(*(long *)context_local + 0x18))();
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        std::__cxx11::string::string((string *)&local_70,(string *)psStack_28);
      }
      else {
        qVar3 = InputSource::getLastOffset((InputSource *)context_local);
        std::__cxx11::to_string(&local_90,qVar3);
        std::operator+(&local_70,"offset ",&local_90);
      }
      qVar3 = InputSource::getLastOffset((InputSource *)context_local);
      message = QPDFTokenizer::Token::getErrorMessage_abi_cxx11_(__return_storage_ptr__);
      QPDFExc::QPDFExc(this_00,qpdf_e_damaged_pdf,filename,&local_70,qVar3,message);
      __cxa_throw(this_00,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
    QTC::TC("qpdf","QPDFTokenizer allowing bad token",0);
  }
  return __return_storage_ptr__;
}

Assistant:

QPDFTokenizer::Token
Tokenizer::readToken(InputSource& input, std::string const& context, bool allow_bad, size_t max_len)
{
    nextToken(input, context, max_len);

    Token token;
    bool unread_char;
    char char_to_unread;
    getToken(token, unread_char, char_to_unread);

    if (token.getType() == tt::tt_bad) {
        if (allow_bad) {
            QTC::TC("qpdf", "QPDFTokenizer allowing bad token");
        } else {
            throw QPDFExc(
                qpdf_e_damaged_pdf,
                input.getName(),
                context.empty() ? "offset " + std::to_string(input.getLastOffset()) : context,
                input.getLastOffset(),
                token.getErrorMessage());
        }
    }
    return token;
}